

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,uint start,uint num,long elements)

{
  RepeatedPtrFieldBase *this_00;
  LogMessage *pLVar1;
  string *psVar2;
  Type *pTVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  LogMessage local_108;
  LogMessage local_d0;
  LogMessage local_98;
  ulong local_60;
  ulong local_58;
  RepeatedPtrFieldBase *local_50;
  ulong local_48;
  long local_40;
  LogFinisher local_31;
  
  uVar6 = (ulong)num;
  uVar4 = (ulong)start;
  local_40 = elements;
  if ((int)start < 0) {
    internal::LogMessage::LogMessage
              (&local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x8aa);
    pLVar1 = internal::LogMessage::operator<<(&local_108,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar1);
    internal::LogMessage::~LogMessage(&local_108);
  }
  if ((int)num < 0) {
    internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x8ab);
    pLVar1 = internal::LogMessage::operator<<(&local_d0,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar1);
    internal::LogMessage::~LogMessage(&local_d0);
  }
  lVar5 = local_40;
  local_50 = &this->super_RepeatedPtrFieldBase;
  if ((this->super_RepeatedPtrFieldBase).current_size_ < (int)(num + start)) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x8ac);
    pLVar1 = internal::LogMessage::operator<<(&local_98,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=(&local_31,pLVar1);
    lVar5 = local_40;
    internal::LogMessage::~LogMessage(&local_98);
  }
  this_00 = local_50;
  if (0 < (int)num) {
    local_58 = uVar6;
    local_48 = uVar4;
    if (lVar5 != 0) {
      local_60 = uVar6;
      if (local_50->arena_ == (Arena *)0x0) {
        uVar4 = 0;
        do {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (this_00,start + (int)uVar4);
          *(Type **)(lVar5 + uVar4 * 8) = pTVar3;
          uVar4 = uVar4 + 1;
        } while (local_60 != uVar4);
      }
      else {
        uVar4 = 0;
        do {
          internal::RepeatedPtrFieldBase::
          Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (this_00,start + (int)uVar4);
          psVar2 = (string *)operator_new(0x20);
          *(string **)psVar2 = psVar2 + 0x10;
          *(undefined8 *)(psVar2 + 8) = 0;
          psVar2[0x10] = (string)0x0;
          std::__cxx11::string::_M_assign(psVar2);
          *(string **)(local_40 + uVar4 * 8) = psVar2;
          uVar4 = uVar4 + 1;
        } while (local_60 != uVar4);
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap(this_00,(int)local_48,(int)local_58);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      if (GetArena() != NULL) {
        // If we're on an arena, we perform a copy for each element so that the
        // returned elements are heap-allocated.
        for (int i = 0; i < num; ++i) {
          Element* element =
              RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
          typename TypeHandler::Type* new_value =
              TypeHandler::NewFromPrototype(element, NULL);
          TypeHandler::Merge(*element, new_value);
          elements[i] = new_value;
        }
      } else {
        for (int i = 0; i < num; ++i) {
          elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
        }
      }
    }
    CloseGap(start, num);
  }
}